

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_latlink_t * ps_lattice_reverse_edges(ps_lattice_t *dag,ps_latnode_t *start,ps_latnode_t *end)

{
  ps_latlink_t *ppVar1;
  ps_latnode_t *ppVar2;
  latlink_list_t *plVar3;
  int iVar4;
  
  do {
    ppVar1 = ps_lattice_popq(dag);
  } while (ppVar1 != (ps_latlink_t *)0x0);
  for (ppVar2 = dag->nodes; ppVar2 != (ps_latnode_t *)0x0; ppVar2 = ppVar2->next) {
    (ppVar2->info).fanin = 0;
    plVar3 = ppVar2->exits;
    if (plVar3 != (latlink_list_t *)0x0) {
      iVar4 = 1;
      do {
        (ppVar2->info).fanin = iVar4;
        plVar3 = plVar3->next;
        iVar4 = iVar4 + 1;
      } while (plVar3 != (latlink_list_s *)0x0);
    }
  }
  if (end == (ps_latnode_t *)0x0) {
    end = dag->end;
  }
  for (plVar3 = end->entries; plVar3 != (latlink_list_t *)0x0; plVar3 = plVar3->next) {
    ps_lattice_pushq(dag,plVar3->link);
  }
  ppVar1 = ps_lattice_reverse_next(dag,start);
  return ppVar1;
}

Assistant:

ps_latlink_t *
ps_lattice_reverse_edges(ps_lattice_t *dag, ps_latnode_t *start, ps_latnode_t *end)
{
    ps_latnode_t *node;
    latlink_list_t *x;

    /* Cancel any unfinished traversal. */
    ps_lattice_delq(dag);

    /* Initialize node fanout counts and path scores. */
    for (node = dag->nodes; node; node = node->next) {
        node->info.fanin = 0;
        for (x = node->exits; x; x = x->next)
            ++node->info.fanin;
    }

    /* Initialize agenda with all entries from end. */
    if (end == NULL) end = dag->end;
    for (x = end->entries; x; x = x->next)
        ps_lattice_pushq(dag, x->link);

    /* Pull the first edge off the queue. */
    return ps_lattice_reverse_next(dag, start);
}